

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema.c
# Opt level: O1

int ingrouping(lys_node *node)

{
  lys_node *iter;
  bool bVar1;
  
  bVar1 = node != (lys_node *)0x0;
  if (bVar1) {
    do {
      if (node->nodetype == LYS_EXT) {
        if (node->padding[1] != '\x01') goto LAB_0015be81;
        node = (lys_node *)node->dsc;
LAB_0015be72:
        if (node->nodetype == LYS_AUGMENT) {
          node = node->prev;
        }
      }
      else {
        if (node->nodetype == LYS_GROUPING) break;
        node = node->parent;
        if (node != (lys_node *)0x0) goto LAB_0015be72;
LAB_0015be81:
        node = (lys_node *)0x0;
      }
      bVar1 = node != (lys_node *)0x0;
    } while (bVar1);
  }
  return (uint)bVar1;
}

Assistant:

static int
ingrouping(const struct lys_node *node)
{
    const struct lys_node *iter = node;
    assert(node);

    for(iter = node; iter && iter->nodetype != LYS_GROUPING; iter = lys_parent(iter));
    if (!iter) {
        return 0;
    } else {
        return 1;
    }
}